

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

char ** lys_features_list(lys_module *module,uint8_t **states)

{
  byte bVar1;
  lys_feature *plVar2;
  char **__ptr;
  uint8_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  lys_include *plVar7;
  ulong uVar8;
  lys_submodule *plVar9;
  uint uVar10;
  ulong uVar11;
  
  if (module == (lys_module *)0x0) {
LAB_00160ae0:
    __ptr = (char **)0x0;
  }
  else {
    bVar1 = module->features_size;
    uVar11 = (ulong)module->inc_size;
    uVar10 = (uint)bVar1;
    if (uVar11 != 0) {
      lVar6 = 0;
      do {
        uVar10 = uVar10 + *(byte *)(*(long *)(module->inc->rev + lVar6 + -8) + 0x4c);
        lVar6 = lVar6 + 0x30;
      } while ((ulong)module->inc_size * 0x30 != lVar6);
    }
    __ptr = (char **)malloc((ulong)(uVar10 + 1) * 8);
    if (__ptr == (char **)0x0) {
      ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
      return (char **)0x0;
    }
    if (states != (uint8_t **)0x0) {
      puVar3 = (uint8_t *)malloc((ulong)(uVar10 + 1));
      *states = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        ly_log(module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_features_list");
        free(__ptr);
        goto LAB_00160ae0;
      }
    }
    if (bVar1 == 0) {
      uVar4 = 0;
    }
    else {
      lVar6 = 0;
      uVar4 = 0;
      do {
        plVar2 = module->features;
        __ptr[uVar4] = *(char **)(plVar2->padding + lVar6 + -0x1c);
        if (states != (uint8_t **)0x0) {
          (*states)[uVar4] = plVar2->padding[lVar6 + -3] & 1;
        }
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 0x40;
      } while (uVar4 < module->features_size);
      uVar11 = (ulong)module->inc_size;
    }
    uVar10 = (uint)uVar4;
    if ((char)uVar11 != '\0') {
      plVar7 = module->inc;
      uVar5 = 0;
      do {
        plVar9 = plVar7[uVar5].submodule;
        if (plVar9->features_size != '\0') {
          lVar6 = 0;
          uVar8 = 0;
          do {
            uVar10 = (int)uVar4 + (int)uVar8;
            plVar2 = plVar9->features;
            __ptr[uVar10] = *(char **)(plVar2->padding + lVar6 + -0x1c);
            if (states != (uint8_t **)0x0) {
              (*states)[uVar10] = plVar2->padding[lVar6 + -3] & 1;
            }
            uVar8 = uVar8 + 1;
            plVar7 = module->inc;
            plVar9 = plVar7[uVar5].submodule;
            lVar6 = lVar6 + 0x40;
          } while (uVar8 < plVar9->features_size);
          uVar11 = (ulong)module->inc_size;
          uVar4 = (ulong)(uint)((int)uVar4 + (int)uVar8);
        }
        uVar10 = (uint)uVar4;
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar11);
    }
    __ptr[uVar10] = (char *)0x0;
  }
  return __ptr;
}

Assistant:

API const char **
lys_features_list(const struct lys_module *module, uint8_t **states)
{
    const char **result = NULL;
    int i, j;
    unsigned int count;

    if (!module) {
        return NULL;
    }

    count = module->features_size;
    for (i = 0; i < module->inc_size; i++) {
        count += module->inc[i].submodule->features_size;
    }
    result = malloc((count + 1) * sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(module->ctx), NULL);

    if (states) {
        *states = malloc((count + 1) * sizeof **states);
        LY_CHECK_ERR_RETURN(!(*states), LOGMEM(module->ctx); free(result), NULL);
    }
    count = 0;

    /* module itself */
    for (i = 0; i < module->features_size; i++) {
        result[count] = module->features[i].name;
        if (states) {
            if (module->features[i].flags & LYS_FENABLED) {
                (*states)[count] = 1;
            } else {
                (*states)[count] = 0;
            }
        }
        count++;
    }

    /* submodules */
    for (j = 0; j < module->inc_size; j++) {
        for (i = 0; i < module->inc[j].submodule->features_size; i++) {
            result[count] = module->inc[j].submodule->features[i].name;
            if (states) {
                if (module->inc[j].submodule->features[i].flags & LYS_FENABLED) {
                    (*states)[count] = 1;
                } else {
                    (*states)[count] = 0;
                }
            }
            count++;
        }
    }

    /* terminating NULL byte */
    result[count] = NULL;

    return result;
}